

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
     *this,int i)

{
  double dVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  
  pFVar2 = (this->left_->fadexpr_).right_;
  pdVar7 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar7 = (pFVar2->dx_).ptr_to_data + i;
  }
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  pFVar3 = (this->right_->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  pdVar8 = &pFVar4->defaultVal;
  if ((pFVar4->dx_).num_elts != 0) {
    pdVar8 = (pFVar4->dx_).ptr_to_data + i;
  }
  pdVar6 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar6 = (pFVar5->dx_).ptr_to_data + i;
  }
  return dVar1 * pFVar2->val_ * (*pdVar8 + *pdVar6) +
         ((pFVar4->val_ + pFVar5->val_) - (this->right_->fadexpr_).right_.constant_) *
         *pdVar7 * dVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}